

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int64_helper.c
# Opt level: O2

void sparc_cpu_do_interrupt_sparc64(CPUState *cs)

{
  CPUSPARCState_conflict1 *env;
  undefined8 *puVar1;
  uint uVar2;
  TranslationBlock *pTVar3;
  target_ulong tVar4;
  target_ulong tVar5;
  ulong uVar6;
  uint32_t new_pstate;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  env = (CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5);
  uVar9 = cs->exception_index;
  if (*(int *)(cs[1].tb_jmp_cache + 0x204) != 1) {
    cpu_get_psr_sparc64(env);
  }
  uVar2 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4);
  if (*(uint *)(cs[1].tb_jmp_cache + 0x57f) <= uVar2) {
    cpu_abort_sparc64(cs,"Trap 0x%04x while trap level (%d) >= MAXTL (%d), Error state",
                      (ulong)(uint)cs->exception_index,(ulong)uVar2);
  }
  if (*(uint *)(cs[1].tb_jmp_cache + 0x57f) - 1 <= uVar2) {
    *(byte *)(cs[1].tb_jmp_cache + 0x57e) = *(byte *)(cs[1].tb_jmp_cache + 0x57e) | 0x20;
  }
  *(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4) = uVar2 + 1;
  uVar10 = (ulong)((uVar2 + 1 & 7) << 5);
  tVar4 = cpu_get_ccr_sparc64(env);
  iVar7 = *(int *)((long)cs[1].tb_jmp_cache + 0x2bec);
  uVar2 = *(uint *)(cs[1].tb_jmp_cache + 0x57e);
  tVar5 = cpu_get_cwp64_sparc64(env);
  uVar6 = tVar5 | (ulong)((uVar2 & 0xf3f) << 8) | (ulong)(uint)(iVar7 << 0x18) | tVar4 << 0x20;
  *(ulong *)((long)cs[1].tb_jmp_cache + uVar10 + 11000) = uVar6;
  pTVar3 = cs[1].tb_jmp_cache[0x1ff];
  puVar1 = (undefined8 *)((long)cs[1].tb_jmp_cache + uVar10 + 0x2ae8);
  *puVar1 = cs[1].tb_jmp_cache[0x1fe];
  puVar1[1] = pTVar3;
  *(uint *)((long)cs[1].tb_jmp_cache + uVar10 + 0x2b00) = uVar9;
  uVar2 = *(uint *)(cs[1].tb_jmp_cache + 0x60b);
  if ((uVar2 >> 0xb & 1) != 0) {
    pTVar3 = cs[1].tb_jmp_cache[0x5e9];
    uVar8 = (ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4);
    cs[1].tb_jmp_cache[uVar8 + 0x5ea] = pTVar3;
    if (2 < uVar8) {
      cs[1].tb_jmp_cache[0x5e9] = (TranslationBlock *)((ulong)pTVar3 | 4);
    }
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    uVar2 = *(uint *)(cs[1].tb_jmp_cache + 0x5e8);
    *(ulong *)((long)cs[1].tb_jmp_cache + uVar10 + 11000) = (ulong)(uVar2 & 7) << 0x28 | uVar6;
    cpu_gl_switch_gregs_sparc64(env,uVar2 + 1);
    *(int *)(cs[1].tb_jmp_cache + 0x5e8) = *(int *)(cs[1].tb_jmp_cache + 0x5e8) + 1;
  }
  if (((uVar9 - 100 < 0xc) || (uVar9 == 8)) || (uVar9 == 0x30)) {
    if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x3059) & 8) == 0) {
      new_pstate = 0x414;
LAB_00906193:
      cpu_change_pstate_sparc64(env,new_pstate);
    }
    else {
      *(byte *)(cs[1].tb_jmp_cache + 0x5e9) = *(byte *)(cs[1].tb_jmp_cache + 0x5e9) | 4;
      *(undefined4 *)(cs[1].tb_jmp_cache + 0x57e) = 0x14;
    }
    if (uVar9 != 0x24) goto LAB_00906213;
    iVar7 = *(int *)(cs[1].tb_jmp_cache + 0x228) + -1;
LAB_00906238:
    iVar7 = cpu_cwp_dec_sparc64(env,iVar7);
  }
  else {
    if (uVar9 == 0x60) {
      if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x3059) & 8) == 0) {
        cpu_change_pstate_sparc64(env,0x814);
      }
      goto LAB_0090625c;
    }
    if ((uVar9 & 0xffffff80) != 0x180 && (uVar9 & 0xfffffffe) != 0x3e) {
      new_pstate = 0x15;
      goto LAB_00906193;
    }
    *(byte *)(cs[1].tb_jmp_cache + 0x5e9) = *(byte *)(cs[1].tb_jmp_cache + 0x5e9) | 4;
LAB_00906213:
    if ((uVar9 & 0x1c0) != 0xc0) {
      if ((uVar9 & 0x1c0) != 0x80) goto LAB_0090625c;
      iVar7 = (*(int *)(cs[1].tb_jmp_cache + 0x228) - *(int *)((long)cs[1].tb_jmp_cache + 0x2bfc)) +
              -2;
      goto LAB_00906238;
    }
    iVar7 = cpu_cwp_inc_sparc64(env,*(int *)(cs[1].tb_jmp_cache + 0x228) + 1);
  }
  cpu_set_cwp_sparc64(env,iVar7);
LAB_0090625c:
  if (((*(byte *)((long)cs[1].tb_jmp_cache + 0x3059) & 8) == 0) ||
     (((ulong)cs[1].tb_jmp_cache[0x5e9] & 4) == 0)) {
    uVar6 = (ulong)cs[1].tb_jmp_cache[0x229] & 0xffffffffffff8000;
    uVar9 = uVar9 << 5 | (uint)(1 < *(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4)) << 0xe;
  }
  else {
    uVar6 = (ulong)cs[1].tb_jmp_cache[0x5f3] & 0xffffffffffffc000;
    uVar9 = uVar9 << 5;
  }
  cs[1].tb_jmp_cache[0x1fe] = (TranslationBlock *)((long)(int)uVar9 | uVar6);
  cs[1].tb_jmp_cache[0x1ff] =
       (TranslationBlock *)((long)&((TranslationBlock *)((long)(int)uVar9 | uVar6))->pc + 4);
  cs->exception_index = -1;
  return;
}

Assistant:

void sparc_cpu_do_interrupt(CPUState *cs)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    int intno = cs->exception_index;
    trap_state *tsptr;

    /* Compute PSR before exposing state.  */
    if (env->cc_op != CC_OP_FLAGS) {
        cpu_get_psr(env);
    }

    if (env->tl >= env->maxtl) {
        cpu_abort(cs, "Trap 0x%04x while trap level (%d) >= MAXTL (%d),"
                  " Error state", cs->exception_index, env->tl, env->maxtl);
        return;
    }
    if (env->tl < env->maxtl - 1) {
        env->tl++;
    } else {
        env->pstate |= PS_RED;
        if (env->tl < env->maxtl) {
            env->tl++;
        }
    }
    tsptr = cpu_tsptr(env);

    tsptr->tstate = (cpu_get_ccr(env) << 32) |
        ((env->asi & 0xff) << 24) | ((env->pstate & 0xf3f) << 8) |
        cpu_get_cwp64(env);
    tsptr->tpc = env->pc;
    tsptr->tnpc = env->npc;
    tsptr->tt = intno;

    if (cpu_has_hypervisor(env)) {
        env->htstate[env->tl] = env->hpstate;
        /* XXX OpenSPARC T1 - UltraSPARC T3 have MAXPTL=2
           but this may change in the future */
        if (env->tl > 2) {
            env->hpstate |= HS_PRIV;
        }
    }

    if (env->def.features & CPU_FEATURE_GL) {
        tsptr->tstate |= (env->gl & 7ULL) << 40;
        cpu_gl_switch_gregs(env, env->gl + 1);
        env->gl++;
    }

    switch (intno) {
    case TT_IVEC:
        if (!cpu_has_hypervisor(env)) {
            cpu_change_pstate(env, PS_PEF | PS_PRIV | PS_IG);
        }
        break;
    case TT_TFAULT:
    case TT_DFAULT:
    case TT_TMISS:
    case TT_TMISS + 1:
    case TT_TMISS + 2:
    case TT_TMISS + 3:

    case TT_DMISS:
    case TT_DMISS + 1:
    case TT_DMISS + 2:
    case TT_DMISS + 3:

    case TT_DPROT:
    case TT_DPROT + 1:
    case TT_DPROT + 2:
    case TT_DPROT + 3:

        if (cpu_has_hypervisor(env)) {
            env->hpstate |= HS_PRIV;
            env->pstate = PS_PEF | PS_PRIV;
        } else {
            cpu_change_pstate(env, PS_PEF | PS_PRIV | PS_MG);
        }
        break;
    // case TT_INSN_REAL_TRANSLATION_MISS ... TT_DATA_REAL_TRANSLATION_MISS:
    // case TT_HTRAP ... TT_HTRAP + 127:
    //     env->hpstate |= HS_PRIV;
    //     break;
    default:
        if (intno >= TT_INSN_REAL_TRANSLATION_MISS && intno <= TT_DATA_REAL_TRANSLATION_MISS) {
            env->hpstate |= HS_PRIV;
            break;
        }
        if (intno >= TT_HTRAP && intno <= TT_HTRAP + 127) {
            env->hpstate |= HS_PRIV;
            break;
        }
        cpu_change_pstate(env, PS_PEF | PS_PRIV | PS_AG);
        break;
    }

    if (intno == TT_CLRWIN) {
        cpu_set_cwp(env, cpu_cwp_dec(env, env->cwp - 1));
    } else if ((intno & 0x1c0) == TT_SPILL) {
        cpu_set_cwp(env, cpu_cwp_dec(env, env->cwp - env->cansave - 2));
    } else if ((intno & 0x1c0) == TT_FILL) {
        cpu_set_cwp(env, cpu_cwp_inc(env, env->cwp + 1));
    }

    if (cpu_hypervisor_mode(env)) {
        env->pc = (env->htba & ~0x3fffULL) | (intno << 5);
    } else {
        env->pc = env->tbr  & ~0x7fffULL;
        env->pc |= ((env->tl > 1) ? 1 << 14 : 0) | (intno << 5);
    }
    env->npc = env->pc + 4;
    cs->exception_index = -1;
}